

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashrate.cpp
# Opt level: O2

void __thiscall xmrig::Hashrate::~Hashrate(Hashrate *this)

{
  uint64_t **ppuVar1;
  size_t i;
  ulong uVar2;
  
  for (uVar2 = 0; ppuVar1 = this->m_counts, uVar2 < this->m_threads; uVar2 = uVar2 + 1) {
    if (ppuVar1[uVar2] != (uint64_t *)0x0) {
      operator_delete__(ppuVar1[uVar2]);
    }
    if (this->m_timestamps[uVar2] != (uint64_t *)0x0) {
      operator_delete__(this->m_timestamps[uVar2]);
    }
  }
  if (ppuVar1 != (uint64_t **)0x0) {
    operator_delete__(ppuVar1);
  }
  if (this->m_timestamps != (uint64_t **)0x0) {
    operator_delete__(this->m_timestamps);
  }
  if (this->m_top != (uint32_t *)0x0) {
    operator_delete__(this->m_top);
    return;
  }
  return;
}

Assistant:

xmrig::Hashrate::~Hashrate()
{
    for (size_t i = 0; i < m_threads; i++) {
        delete [] m_counts[i];
        delete [] m_timestamps[i];
    }

    delete [] m_counts;
    delete [] m_timestamps;
    delete [] m_top;
}